

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

bool bssl::anon_unknown_0::CreateClientAndServer
               (UniquePtr<SSL> *out_client,UniquePtr<SSL> *out_server,SSL_CTX *client_ctx,
               SSL_CTX *server_ctx)

{
  bool bVar1;
  int iVar2;
  SSL *pSVar3;
  BIO *local_60;
  BIO *bio2;
  BIO *bio1;
  unique_ptr<ssl_st,_bssl::internal::Deleter> local_40;
  UniquePtr<SSL> server;
  UniquePtr<SSL> client;
  SSL_CTX *server_ctx_local;
  SSL_CTX *client_ctx_local;
  UniquePtr<SSL> *out_server_local;
  UniquePtr<SSL> *out_client_local;
  
  pSVar3 = SSL_new((SSL_CTX *)client_ctx);
  std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&server,(pointer)pSVar3);
  pSVar3 = SSL_new((SSL_CTX *)server_ctx);
  std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&local_40,(pointer)pSVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&server);
  if ((bVar1) && (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_40), bVar1)) {
    pSVar3 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
    SSL_set_connect_state(pSVar3);
    pSVar3 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&local_40);
    SSL_set_accept_state(pSVar3);
    iVar2 = BIO_new_bio_pair(&bio2,0,(BIO **)&local_60,0);
    if (iVar2 == 0) {
      out_client_local._7_1_ = false;
    }
    else {
      pSVar3 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
      SSL_set_bio(pSVar3,(BIO *)bio2,(BIO *)bio2);
      pSVar3 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&local_40);
      SSL_set_bio(pSVar3,local_60,local_60);
      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::operator=(out_client,&server);
      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::operator=(out_server,&local_40);
      out_client_local._7_1_ = true;
    }
  }
  else {
    out_client_local._7_1_ = false;
  }
  bio1._0_4_ = 1;
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
  return out_client_local._7_1_;
}

Assistant:

static bool CreateClientAndServer(bssl::UniquePtr<SSL> *out_client,
                                  bssl::UniquePtr<SSL> *out_server,
                                  SSL_CTX *client_ctx, SSL_CTX *server_ctx) {
  bssl::UniquePtr<SSL> client(SSL_new(client_ctx)), server(SSL_new(server_ctx));
  if (!client || !server) {
    return false;
  }
  SSL_set_connect_state(client.get());
  SSL_set_accept_state(server.get());

  BIO *bio1, *bio2;
  if (!BIO_new_bio_pair(&bio1, 0, &bio2, 0)) {
    return false;
  }
  // SSL_set_bio takes ownership.
  SSL_set_bio(client.get(), bio1, bio1);
  SSL_set_bio(server.get(), bio2, bio2);

  *out_client = std::move(client);
  *out_server = std::move(server);
  return true;
}